

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpGCTest_Collect_Basic_Test::~InterpGCTest_Collect_Basic_Test
          (InterpGCTest_Collect_Basic_Test *this)

{
  InterpTest::~InterpTest((InterpTest *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_Basic) {
  auto foreign = Foreign::New(store_, nullptr);
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 1, after_new);

  // Remove root, but object is not destroyed until collect.
  foreign.reset();
  EXPECT_EQ(after_new, store_.object_count());
}